

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

void __thiscall btCollisionWorldImporter::~btCollisionWorldImporter(btCollisionWorldImporter *this)

{
  btHashMap<btHashString,_btCollisionObject_*> *in_RDI;
  
  *(undefined ***)&in_RDI->m_hashTable = &PTR__btCollisionWorldImporter_002e2d68;
  btHashMap<btHashPtr,_btCollisionObject_*>::~btHashMap
            ((btHashMap<btHashPtr,_btCollisionObject_*> *)in_RDI);
  btHashMap<btHashPtr,_btCollisionShape_*>::~btHashMap
            ((btHashMap<btHashPtr,_btCollisionShape_*> *)in_RDI);
  btHashMap<btHashPtr,_const_char_*>::~btHashMap((btHashMap<btHashPtr,_const_char_*> *)in_RDI);
  btHashMap<btHashString,_btCollisionObject_*>::~btHashMap(in_RDI);
  btHashMap<btHashString,_btCollisionShape_*>::~btHashMap
            ((btHashMap<btHashString,_btCollisionShape_*> *)in_RDI);
  btHashMap<btHashPtr,_btTriangleInfoMap_*>::~btHashMap
            ((btHashMap<btHashPtr,_btTriangleInfoMap_*> *)in_RDI);
  btHashMap<btHashPtr,_btOptimizedBvh_*>::~btHashMap
            ((btHashMap<btHashPtr,_btOptimizedBvh_*> *)in_RDI);
  btAlignedObjectArray<btVector3DoubleData_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3DoubleData_*> *)0x1843e4);
  btAlignedObjectArray<btVector3FloatData_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3FloatData_*> *)0x1843f5);
  btAlignedObjectArray<unsigned_char_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_char_*> *)0x184406);
  btAlignedObjectArray<short_*>::~btAlignedObjectArray((btAlignedObjectArray<short_*> *)0x184417);
  btAlignedObjectArray<int_*>::~btAlignedObjectArray((btAlignedObjectArray<int_*> *)0x184428);
  btAlignedObjectArray<char_*>::~btAlignedObjectArray((btAlignedObjectArray<char_*> *)0x184439);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionObject_*> *)0x18444a);
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)0x18445b);
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btTriangleIndexVertexArray_*> *)0x18446c);
  btAlignedObjectArray<btTriangleInfoMap_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btTriangleInfoMap_*> *)0x18447a);
  btAlignedObjectArray<btOptimizedBvh_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btOptimizedBvh_*> *)0x184488);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionObject_*> *)0x184496);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionShape_*> *)0x1844a4);
  return;
}

Assistant:

btCollisionWorldImporter::~btCollisionWorldImporter()
{
}